

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

RefNull * __thiscall wasm::Builder::makeRefNull(Builder *this,HeapType type)

{
  BasicHeapType BVar1;
  Type TVar2;
  HeapType heapType;
  HeapType local_28;
  HeapType type_local;
  
  local_28.id = type.id;
  TVar2.id = (uintptr_t)MixedArena::alloc<wasm::RefNull>(&this->wasm->allocator);
  BVar1 = HeapType::getBottom(&local_28);
  heapType.id._4_4_ = 0;
  heapType.id._0_4_ = BVar1;
  Type::Type((Type *)&type_local,heapType,Nullable,Inexact);
  wasm::RefNull::finalize(TVar2);
  return (RefNull *)TVar2.id;
}

Assistant:

RefNull* makeRefNull(HeapType type) {
    auto* ret = wasm.allocator.alloc<RefNull>();
    ret->finalize(Type(type.getBottom(), Nullable));
    return ret;
  }